

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::PackedSlice::PackedSlice
          (PackedSlice *this,Var *parent,PackedStructFieldDef *def,string *member_name)

{
  InternalException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  VarSlice::VarSlice(&this->super_VarSlice,parent,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002b84a8;
  this->def_ = def;
  this->original_struct_ = (PackedStruct *)0x0;
  if (def->struct_ != (PackedStruct *)0x0) {
    set_up(this,def->struct_,member_name);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"Invalid member access ",&def->name);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PackedSlice::PackedSlice(Var *parent, const PackedStructFieldDef *def,
                         const std::string &member_name)
    : VarSlice(parent, 0, 0), def_(def) {
    if (!def->struct_) {
        throw InternalException("Invalid member access " + def->name);
    }
    set_up(*def->struct_, member_name);
}